

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O2

void predict(stagewise_poly *poly,single_learner *base,example *ec)

{
  poly->original_ec = ec;
  synthetic_create(poly,ec,false);
  LEARNER::learner<char,_example>::predict(base,&poly->synth_ec,0);
  ec->partial_prediction = (poly->synth_ec).partial_prediction;
  ec->updated_prediction = (poly->synth_ec).updated_prediction;
  (ec->pred).scalar = (poly->synth_ec).pred.scalar;
  return;
}

Assistant:

void predict(stagewise_poly &poly, single_learner &base, example &ec)
{
  poly.original_ec = &ec;
  synthetic_create(poly, ec, false);
  base.predict(poly.synth_ec);
  ec.partial_prediction = poly.synth_ec.partial_prediction;
  ec.updated_prediction = poly.synth_ec.updated_prediction;
  ec.pred.scalar = poly.synth_ec.pred.scalar;
}